

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  clock_t cVar4;
  clock_t cVar5;
  long in_RSI;
  int in_EDI;
  int timeEnd;
  int timeBegin;
  size_t i_4;
  size_t i_3;
  bool found;
  char *p;
  char *rest;
  char *opt;
  size_t i_2;
  size_t i_1;
  int i;
  char *hashToTest;
  char *defaulthash;
  ulong local_68;
  ulong local_60;
  char *local_48;
  char *in_stack_ffffffffffffffc0;
  ulong local_38;
  ulong local_30;
  int local_24;
  char *local_20;
  
  if (in_EDI < 2) {
    printf("No test hash given on command line, testing %s.\n","xxh3");
    printf("Usage: SMHasher [--list][--tests] [--verbose][--extra]\n or --test=Speed,... hash\n");
  }
  else {
    local_24 = 1;
    local_20 = *(char **)(in_RSI + 8);
    iVar2 = strncmp(local_20,"--",2);
    if (iVar2 == 0) {
      iVar2 = strcmp(local_20,"--help");
      if (iVar2 == 0) {
        printf("Usage: SMHasher [--list][--tests] [--verbose][--extra]\n or --test=Speed,... hash\n"
              );
        exit(0);
      }
      iVar2 = strcmp(local_20,"--list");
      if (iVar2 == 0) {
        for (local_30 = 0; local_30 < 0x74; local_30 = local_30 + 1) {
          printf("%-16s\t\"%s\" %s\n",g_hashes[local_30].name,g_hashes[local_30].desc,
                 quality_str[g_hashes[local_30].quality]);
        }
        exit(0);
      }
      iVar2 = strcmp(local_20,"--tests");
      if (iVar2 == 0) {
        printf("Valid tests:\n");
        for (local_38 = 0; local_38 < 0x12; local_38 = local_38 + 1) {
          printf("  %s\n",g_testopts[local_38].name);
        }
        exit(0);
      }
      iVar2 = strcmp(local_20,"--verbose");
      if (iVar2 == 0) {
        g_drawDiagram = true;
        local_24 = 2;
        if (in_EDI < 3) {
          local_20 = "xxh3";
        }
        else {
          local_20 = *(char **)(in_RSI + 0x10);
        }
      }
      iVar2 = strcmp(local_20,"--extra");
      if (iVar2 == 0) {
        g_testExtra = true;
        if (local_24 + 1 < in_EDI) {
          local_20 = *(char **)(in_RSI + (long)(local_24 + 1) * 8);
        }
        else {
          local_20 = "xxh3";
        }
      }
      iVar2 = strncmp(local_20,"--test=",6);
      if (iVar2 == 0) {
        local_48 = local_20 + 7;
        bVar1 = false;
        g_testAll = false;
        do {
          pcVar3 = strchr(local_48,0x2c);
          in_stack_ffffffffffffffc0 = local_48;
          if (pcVar3 != (char *)0x0) {
            in_stack_ffffffffffffffc0 = strndup(local_48,(long)pcVar3 - (long)local_48);
            local_48 = pcVar3 + 1;
          }
          for (local_60 = 0; local_60 < 0x12; local_60 = local_60 + 1) {
            iVar2 = strcmp(in_stack_ffffffffffffffc0,g_testopts[local_60].name);
            if (iVar2 == 0) {
              *g_testopts[local_60].var = true;
              bVar1 = true;
              break;
            }
          }
          if (!bVar1) {
            printf("Invalid option: --test=%s\n",in_stack_ffffffffffffffc0);
            printf("Valid tests: --test=%s",g_testopts[0].name);
            for (local_68 = 1; local_68 < 0x12; local_68 = local_68 + 1) {
              printf(",%s",g_testopts[local_68].name);
            }
            printf("\n");
            exit(0);
          }
        } while (pcVar3 != (char *)0x0);
      }
    }
  }
  cVar4 = clock();
  testHash(in_stack_ffffffffffffffc0);
  cVar5 = clock();
  printf("\n");
  fflush((FILE *)0x0);
  printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n",(ulong)g_inputVCode,
         (ulong)g_outputVCode,(ulong)g_resultVCode);
  printf("Verification value is 0x%08x - Testing took %f seconds\n",
         (double)((int)cVar5 - (int)cVar4) / 1000000.0,(ulong)g_verify);
  printf("-------------------------------------------------------------------------------\n");
  fflush((FILE *)0x0);
  return 0;
}

Assistant:

int main ( int argc, const char ** argv )
{
#if (defined(__x86_64__) && __SSE4_2__) || defined(_M_X64) || defined(_X86_64_)
  const char * defaulthash = "xxh3"; // because it fails some tests
#else
  const char * defaulthash = "wyhash";
#endif
  const char * hashToTest = defaulthash;

  if(argc < 2) {
    printf("No test hash given on command line, testing %s.\n", hashToTest);
    printf("Usage: SMHasher [--list][--tests] [--verbose][--extra]\n"
           " or --test=Speed,... hash\n");
  }
  else {
    int i = 1;
    hashToTest = argv[i];

    if (strncmp(hashToTest,"--", 2) == 0) {
      if (strcmp(hashToTest,"--help") == 0) {
        printf("Usage: SMHasher [--list][--tests] [--verbose][--extra]\n"
               " or --test=Speed,... hash\n");
        exit(0);
      }
      if (strcmp(hashToTest,"--list") == 0) {
        for(size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
          printf("%-16s\t\"%s\" %s\n", g_hashes[i].name, g_hashes[i].desc, quality_str[g_hashes[i].quality]);
        }
        exit(0);
      }
      if (strcmp(hashToTest,"--tests") == 0) {
        printf("Valid tests:\n");
        for(size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
          printf("  %s\n", g_testopts[i].name);
        }
        exit(0);
      }
      if (strcmp(hashToTest,"--verbose") == 0) {
        g_drawDiagram = true;
        i++;
        if (argc > i)
          hashToTest = argv[i];
        else
          hashToTest = defaulthash;
      }
      if (strcmp(hashToTest,"--extra") == 0) {
        g_testExtra = true;
        i++;
        if (argc > i)
          hashToTest = argv[i];
        else
          hashToTest = defaulthash;
      }
      /* default: --test=All. comma seperated list of options */
      if (strncmp(hashToTest,"--test=", 6) == 0) {
        char *opt = (char *)&hashToTest[7];
        char *rest = opt;
        char *p;
        bool found = false;
        g_testAll = false;
        do {
          if ((p = strchr(rest, ','))) {
            opt = strndup(rest, p-rest);
            rest = p+1;
          } else {
            opt = rest;
          }
          for(size_t i = 0; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
            if (strcmp(opt, g_testopts[i].name) == 0) {
              g_testopts[i].var = true; found = true; break;
            }
          }
          if (!found) {
            printf("Invalid option: --test=%s\n", opt);
            printf("Valid tests: --test=%s", g_testopts[0].name);
            for(size_t i = 1; i < sizeof(g_testopts) / sizeof(TestOpts); i++) {
              printf(",%s", g_testopts[i].name);
            }
            printf("\n");
            exit(0);
          }
        } while (p);
      }
      i++;
      if (argc > i)
        hashToTest = argv[i];
      else
        hashToTest = defaulthash;
    }
  }

  // Code runs on the 3rd CPU by default
  //SetAffinity((1 << 2));
  //SelfTest();

  int timeBegin = clock();

  testHash(hashToTest);

  int timeEnd = clock();

  printf("\n");
  fflush(NULL);
  printf("Input vcode 0x%08x, Output vcode 0x%08x, Result vcode 0x%08x\n", g_inputVCode, g_outputVCode, g_resultVCode);
  printf("Verification value is 0x%08x - Testing took %f seconds\n", g_verify, double(timeEnd-timeBegin)/double(CLOCKS_PER_SEC));
  printf("-------------------------------------------------------------------------------\n");
  fflush(NULL);
  return 0;
}